

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void CopySmallPattern8b(uint8_t *src,uint8_t *dst,int length,uint32_t pattern)

{
  uint32_t in_ECX;
  int in_EDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  int i;
  int local_1c;
  uint32_t local_18;
  int local_14;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (((ulong)local_10 & 3) != 0) {
    *local_10 = *local_8;
    local_18 = Rotate8b(local_18);
    local_14 = local_14 + -1;
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
  }
  for (local_1c = 0; local_1c < local_14 >> 2; local_1c = local_1c + 1) {
    *(uint32_t *)(local_10 + (long)local_1c * 4) = local_18;
  }
  for (local_1c = local_1c << 2; local_1c < local_14; local_1c = local_1c + 1) {
    local_10[local_1c] = local_8[local_1c];
  }
  return;
}

Assistant:

static WEBP_INLINE void CopySmallPattern8b(const uint8_t* src, uint8_t* dst,
                                           int length, uint32_t pattern) {
  int i;
  // align 'dst' to 4-bytes boundary. Adjust the pattern along the way.
  while ((uintptr_t)dst & 3) {
    *dst++ = *src++;
    pattern = Rotate8b(pattern);
    --length;
  }
  // Copy the pattern 4 bytes at a time.
  for (i = 0; i < (length >> 2); ++i) {
    ((uint32_t*)dst)[i] = pattern;
  }
  // Finish with left-overs. 'pattern' is still correctly positioned,
  // so no Rotate8b() call is needed.
  for (i <<= 2; i < length; ++i) {
    dst[i] = src[i];
  }
}